

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::Runner::runTestsForGroup(Runner *this,RunContext *context,TestCaseFilters *filterGroup)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *this_00;
  value_type *__x;
  TestCaseFilters *this_01;
  long in_RSI;
  TestCase *in_RDI;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar4;
  int testsRunForGroup;
  const_iterator itEnd;
  const_iterator it;
  TestCase *in_stack_000001f8;
  RunContext *in_stack_00000200;
  TestCaseFilters *in_stack_fffffffffffffee8;
  RunContext *in_stack_fffffffffffffef0;
  string *psVar5;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  byte bVar6;
  TestCase *this_02;
  string local_b8 [39];
  byte local_91;
  string local_90 [32];
  _Base_ptr local_70;
  undefined1 local_68;
  _Self local_40;
  _Self local_38;
  int local_2c;
  TestCase *local_28;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_20 [4];
  
  this_02 = in_RDI;
  Totals::Totals((Totals *)in_stack_fffffffffffffef0);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
  local_20[0]._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_fffffffffffffee8);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))();
  local_28 = (TestCase *)
             std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        in_stack_fffffffffffffee8);
  local_2c = 0;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffef0,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(local_20);
    bVar1 = TestCaseFilters::shouldInclude((TestCaseFilters *)this_02,in_RDI);
    if (bVar1) {
      local_2c = local_2c + 1;
      this_00 = (set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                 *)(in_RSI + 0x210);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(local_20);
      local_38._M_node =
           (_Base_ptr)
           std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
           find((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                 *)CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                (key_type *)in_stack_fffffffffffffef0);
      local_40._M_node =
           (_Base_ptr)
           std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
           end((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *
               )in_stack_fffffffffffffee8);
      bVar1 = std::operator==(&local_38,&local_40);
      if (bVar1) {
        bVar1 = RunContext::aborting(in_stack_fffffffffffffef0);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator*(local_20);
        RunContext::runTest(in_stack_00000200,in_stack_000001f8);
        Totals::operator+=((Totals *)in_stack_fffffffffffffef0,(Totals *)in_stack_fffffffffffffee8);
        __x = (value_type *)(in_RSI + 0x210);
        __gnu_cxx::
        __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator*(local_20);
        pVar4 = std::
                set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
                insert(this_00,__x);
        local_70 = (_Base_ptr)pVar4.first._M_node;
        local_68 = pVar4.second;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_20);
  }
  local_91 = 0;
  bVar6 = 0;
  if (local_2c == 0) {
    TestCaseFilters::getName_abi_cxx11_(in_stack_fffffffffffffee8);
    local_91 = 1;
    bVar6 = std::__cxx11::string::empty();
    bVar6 = bVar6 ^ 0xff;
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((bVar6 & 1) != 0) {
    this_01 = (TestCaseFilters *)
              Ptr<Catch::IStreamingReporter>::operator->
                        ((Ptr<Catch::IStreamingReporter> *)(in_RSI + 0x208));
    psVar5 = local_b8;
    TestCaseFilters::getName_abi_cxx11_(this_01);
    (*(code *)(this_01->m_tagExpressions).
              super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>.
              _M_impl.super__Vector_impl_data._M_start[1].m_tagSets.
              super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(this_01,psVar5);
    std::__cxx11::string::~string(local_b8);
  }
  return (Totals *)this_02;
}

Assistant:

Totals runTestsForGroup( RunContext& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCase>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCase>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 && !filterGroup.getName().empty() )
                m_reporter->noMatchingTestCases( filterGroup.getName() );
            return totals;

        }